

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O0

sexp_conflict
sexp_close_file_descriptor_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0)

{
  undefined1 auVar1 [16];
  int iVar2;
  int *in_RCX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sexp_conflict res;
  int err;
  int local_40;
  sexp_conflict local_38;
  sexp_conflict local_8;
  
  if (((((ulong)in_RCX & 3) == 0) && (*in_RCX == 0x12)) || (((ulong)in_RCX & 1) == 1)) {
    if ((((ulong)in_RCX & 3) == 0) && (*in_RCX == 0x12)) {
      local_40 = (int)*(undefined8 *)(in_RCX + 4);
    }
    else {
      auVar1._8_8_ = (long)in_RCX >> 0x3f;
      auVar1._0_8_ = (ulong)in_RCX & 0xfffffffffffffffe;
      local_40 = SUB164(auVar1 / SEXT816(2),0);
    }
    iVar2 = close(local_40);
    if (iVar2 == 0) {
      local_38 = (sexp_conflict)0x13e;
    }
    else {
      local_38 = (sexp_conflict)0x3e;
    }
    local_8 = local_38;
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,0x12,in_RCX);
  }
  return local_8;
}

Assistant:

sexp sexp_close_file_descriptor_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0) {
  int err = 0;
  sexp res;
  if (! (sexp_filenop(arg0) || sexp_fixnump(arg0)))
    return sexp_type_exception(ctx, self, SEXP_FILENO, arg0);
  err = close((sexp_filenop(arg0) ? sexp_fileno_fd(arg0) : sexp_unbox_fixnum(arg0)));
  if (err) {
  res = SEXP_FALSE;
  } else {
  res = SEXP_TRUE;
  }
  return res;
}